

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O1

sxi32 SyRandomnessInit(SyPRNGCtx *pCtx,ProcRandomSeed xSeed,void *pUserData)

{
  uchar uVar1;
  byte bVar2;
  sxi32 in_EAX;
  int __fd;
  ssize_t sVar3;
  long lVar4;
  undefined8 uVar5;
  pid_t pid;
  char zSeed [256];
  __pid_t local_11c;
  char local_118 [4];
  timeval local_114 [15];
  
  if (pCtx->nMagic == 0x13c4) {
    return in_EAX;
  }
  __fd = open("/dev/urandom",0);
  if (-1 < __fd) {
    sVar3 = read(__fd,local_118,0x100);
    close(__fd);
    if (0 < sVar3) goto LAB_00115a0a;
  }
  local_11c = getpid();
  SyMemcpy(&local_11c,local_118,4);
  gettimeofday((timeval *)(local_118 + 4),(__timezone_ptr_t)0x0);
LAB_00115a0a:
  pCtx->i = '\0';
  pCtx->j = '\0';
  lVar4 = 0;
  do {
    pCtx->s[lVar4] = (uchar)lVar4;
    lVar4 = lVar4 + 1;
  } while (lVar4 != 0x100);
  uVar5 = CONCAT71(1,pCtx->j);
  lVar4 = 0;
  do {
    bVar2 = (char)uVar5 + local_118[lVar4] + pCtx->s[lVar4];
    uVar5 = CONCAT71((int7)((ulong)uVar5 >> 8),bVar2);
    uVar1 = pCtx->s[bVar2];
    pCtx->s[bVar2] = pCtx->s[lVar4];
    pCtx->s[lVar4] = uVar1;
    lVar4 = lVar4 + 1;
  } while (lVar4 != 0x100);
  pCtx->j = bVar2;
  pCtx->nMagic = 0x13c4;
  return (sxi32)uVar5;
}

Assistant:

JX9_PRIVATE sxi32 SyRandomnessInit(SyPRNGCtx *pCtx, ProcRandomSeed xSeed, void * pUserData)
{
	char zSeed[256];
	sxu8 t;
	sxi32 rc;
	sxu32 i;
	if( pCtx->nMagic == SXPRNG_MAGIC ){
		return SXRET_OK; /* Already initialized */
	}
 /* Initialize the state of the random number generator once, 
  ** the first time this routine is called.The seed value does
  ** not need to contain a lot of randomness since we are not
  ** trying to do secure encryption or anything like that...
  */	
	if( xSeed == 0 ){
		xSeed = SyOSUtilRandomSeed;
	}
	rc = xSeed(zSeed, sizeof(zSeed), pUserData);
	if( rc != SXRET_OK ){
		return rc;
	}
	pCtx->i = pCtx->j = 0;
	for(i=0; i < SX_ARRAYSIZE(pCtx->s) ; i++){
		pCtx->s[i] = (unsigned char)i;
    }
    for(i=0; i < sizeof(zSeed) ; i++){
      pCtx->j += pCtx->s[i] + zSeed[i];
      t = pCtx->s[pCtx->j];
      pCtx->s[pCtx->j] = pCtx->s[i];
      pCtx->s[i] = t;
    }
	pCtx->nMagic = SXPRNG_MAGIC;
	
	return SXRET_OK;
}